

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_limit_h_at_complexity
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL hmin,REF_DBL hmax,REF_DBL target_complexity)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  REF_NODE local_78;
  double local_68;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL current_complexity;
  int local_48;
  REF_INT relaxations;
  REF_INT node;
  REF_INT i;
  REF_NODE ref_node;
  REF_DBL target_complexity_local;
  REF_DBL hmax_local;
  REF_DBL hmin_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  _node = ref_grid->node;
  current_complexity._4_4_ = 0;
  ref_node = (REF_NODE)target_complexity;
  target_complexity_local = hmax;
  hmax_local = hmin;
  hmin_local = (REF_DBL)ref_grid;
  ref_grid_local = (REF_GRID)metric;
  while( true ) {
    if (9 < current_complexity._4_4_) {
      return 0;
    }
    uVar1 = ref_metric_complexity
                      ((REF_DBL *)ref_grid_local,(REF_GRID)hmin_local,
                       (REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) break;
    if (_ref_private_macro_code_rss_1 * 1e+20 <= 0.0) {
      local_68 = -(_ref_private_macro_code_rss_1 * 1e+20);
    }
    else {
      local_68 = _ref_private_macro_code_rss_1 * 1e+20;
    }
    if ((double)ref_node <= 0.0) {
      local_78 = (REF_NODE)((ulong)ref_node ^ 0x8000000000000000);
    }
    else {
      local_78 = ref_node;
    }
    if (local_68 <= (double)local_78) {
      return 4;
    }
    for (local_48 = 0; local_48 < _node->max; local_48 = local_48 + 1) {
      if (((-1 < local_48) && (local_48 < _node->max)) && (-1 < _node->global[local_48])) {
        for (relaxations = 0; relaxations < 6; relaxations = relaxations + 1) {
          dVar3 = pow((double)ref_node / _ref_private_macro_code_rss_1,0.6666666666666666);
          lVar2 = (long)(relaxations + local_48 * 6);
          ref_grid_local->cell[lVar2 + -2] =
               (REF_CELL)(dVar3 * (double)ref_grid_local->cell[lVar2 + -2]);
        }
      }
    }
    uVar1 = ref_metric_limit_h((REF_DBL *)ref_grid_local,(REF_GRID)hmin_local,hmax_local,
                               target_complexity_local);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x862,"ref_metric_limit_h_at_complexity",(ulong)uVar1,"limit h");
      return uVar1;
    }
    current_complexity._4_4_ = current_complexity._4_4_ + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x85a,
         "ref_metric_limit_h_at_complexity",(ulong)uVar1,"cmp");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_h_at_complexity(REF_DBL *metric,
                                                    REF_GRID ref_grid,
                                                    REF_DBL hmin, REF_DBL hmax,
                                                    REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node, relaxations;
  REF_DBL current_complexity;

  /* global scaling and h limits */
  for (relaxations = 0; relaxations < 10; relaxations++) {
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(target_complexity, current_complexity)) {
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(target_complexity / current_complexity, 2.0 / 3.0);
    }
    RSS(ref_metric_limit_h(metric, ref_grid, hmin, hmax), "limit h");
  }

  return REF_SUCCESS;
}